

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

RootBlock * __thiscall SQASTReader::readAst(SQASTReader *this,SQChar **sourcename)

{
  bool bVar1;
  int8_t iVar2;
  int iVar3;
  SQASTReader *this_00;
  undefined4 extraout_var;
  SQChar *pSVar4;
  undefined8 *in_RSI;
  SQASTReader *in_RDI;
  RootBlock *root;
  size_t dataOffset;
  uintptr_t stringTableOffset;
  uint32_t sourceNameIdx;
  uint8_t sq_float_size;
  uint8_t sq_int_size;
  uint8_t version;
  char *m;
  SQASTReader *in_stack_ffffffffffffffc0;
  SQASTReader *in_stack_ffffffffffffffd0;
  RootBlock *local_8;
  
  iVar3 = _setjmp((__jmp_buf_tag *)in_RDI->_errorjmp);
  if (iVar3 == 0) {
    (*in_RDI->stream->_vptr_InputStream[4])(in_RDI->stream,0);
    bVar1 = checkMagic(in_stack_ffffffffffffffd0);
    if (!bVar1) {
      error(in_RDI,"Not a AST bionary data");
    }
    InputStream::readInt8((InputStream *)in_stack_ffffffffffffffc0);
    iVar2 = InputStream::readInt8((InputStream *)in_stack_ffffffffffffffc0);
    in_RDI->op_delta = (int)iVar2;
    InputStream::readInt8((InputStream *)in_stack_ffffffffffffffc0);
    InputStream::readInt8((InputStream *)in_stack_ffffffffffffffc0);
    InputStream::readUInt32((InputStream *)0x141d34);
    this_00 = (SQASTReader *)InputStream::readRawUInt64((InputStream *)in_stack_ffffffffffffffd0);
    iVar3 = (*in_RDI->stream->_vptr_InputStream[3])();
    (*in_RDI->stream->_vptr_InputStream[4])(in_RDI->stream,this_00);
    readStringTable(this_00);
    (*in_RDI->stream->_vptr_InputStream[4])(in_RDI->stream,CONCAT44(extraout_var,iVar3));
    pSVar4 = getString(in_stack_ffffffffffffffc0,(uint)((ulong)in_RDI >> 0x20));
    *in_RSI = pSVar4;
    local_8 = readRoot(this_00);
  }
  else {
    local_8 = (RootBlock *)0x0;
  }
  return local_8;
}

Assistant:

RootBlock *SQASTReader::readAst(const SQChar *&sourcename) {
  if (setjmp(_errorjmp) == 0) {
    stream->seek(0);

    const char *m = MAGIC;

    if (!checkMagic()) {
      error("Not a AST bionary data");
    }

    uint8_t version = stream->readInt8();
    op_delta = stream->readInt8();
    uint8_t sq_int_size = stream->readInt8();
    uint8_t sq_float_size = stream->readInt8();

    uint32_t sourceNameIdx = stream->readUInt32();

    uintptr_t stringTableOffset = stream->readRawUInt64();
    size_t dataOffset = stream->pos();

    stream->seek(stringTableOffset);
    readStringTable();
    stream->seek(dataOffset);

    sourcename = getString(sourceNameIdx);

    RootBlock *root = readRoot();

    assert(stream->pos() == stringTableOffset);

    return root;
  }
  else {
    return nullptr;
  }
}